

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStreamingReporter * __thiscall
Catch::LegacyReporterRegistrar<Catch::JunitReporter>::ReporterFactory::create
          (ReporterFactory *this,ReporterConfig *config)

{
  IReporter *p;
  Ptr<Catch::IReporter> *this_00;
  ReporterConfig *in_stack_00000038;
  JunitReporter *in_stack_00000040;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffdc;
  LegacyReporterAdapter *in_stack_ffffffffffffffe0;
  
  p = (IReporter *)operator_new(0x18);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffd8);
  this_00 = (Ptr<Catch::IReporter> *)operator_new(0x3a8);
  JunitReporter::JunitReporter(in_stack_00000040,in_stack_00000038);
  Ptr<Catch::IReporter>::Ptr(this_00,p);
  LegacyReporterAdapter::LegacyReporterAdapter
            (in_stack_ffffffffffffffe0,
             (Ptr<Catch::IReporter> *)CONCAT44(in_stack_ffffffffffffffdc,uVar1));
  Ptr<Catch::IReporter>::~Ptr(this_00);
  return (IStreamingReporter *)p;
}

Assistant:

virtual IStreamingReporter* create( ReporterConfig const& config ) const {
                return new LegacyReporterAdapter( new T( config ) );
            }